

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_help.cpp
# Opt level: O3

void __thiscall
ktx::OptionsHelp::process(OptionsHelp *this,Options *param_1,ParseResult *args,Reporter *report)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  size_t sVar5;
  OptionValue *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  const_iterator cVar7;
  size_type sVar8;
  long *plVar9;
  long lVar10;
  undefined1 local_17a;
  undefined1 local_179;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  string local_158;
  Reporter *local_138;
  string local_130;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  paVar1 = &local_130.field_2;
  local_138 = report;
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"command","");
  sVar5 = cxxopts::ParseResult::count(args,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (sVar5 != 0) {
    if ((process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::command_table_abi_cxx11_
         == '\0') &&
       (iVar4 = __cxa_guard_acquire(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)
                                     ::command_table_abi_cxx11_), iVar4 != 0)) {
      local_130._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"create","");
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"extract","");
      local_f0[0] = local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"encode","");
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"transcode","");
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"info","");
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"validate","");
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"compare","");
      plVar9 = local_40;
      local_50[0] = plVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"help","");
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                     command_table_abi_cxx11_,&local_130,&stack0xffffffffffffffd0,0,&local_158,
                 &local_179,&local_17a);
      lVar10 = -0x100;
      do {
        if (plVar9 != (long *)plVar9[-2]) {
          operator_delete((long *)plVar9[-2],*plVar9 + 1);
        }
        plVar9 = plVar9 + -4;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                    command_table_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                           command_table_abi_cxx11_);
    }
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"command","");
    this_00 = cxxopts::ParseResult::operator[](args,&local_158);
    pbVar6 = cxxopts::OptionValue::as<std::__cxx11::string>(this_00);
    pcVar2 = (pbVar6->_M_dataplus)._M_p;
    local_178 = &local_168;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,pcVar2,pcVar2 + pbVar6->_M_string_length);
    sVar3 = local_170;
    paVar1 = local_178;
    if (local_170 != 0) {
      sVar8 = 0;
      do {
        iVar4 = tolower((int)paVar1->_M_local_buf[sVar8]);
        paVar1->_M_local_buf[sVar8] = (char)iVar4;
        sVar8 = sVar8 + 1;
      } while (sVar3 != sVar8);
    }
    local_130._M_dataplus._M_p = (pointer)local_178;
    if (local_178 == &local_168) {
      local_130.field_2._8_8_ = local_168._8_8_;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    local_130.field_2._M_allocated_capacity._1_7_ = local_168._M_allocated_capacity._1_7_;
    local_130.field_2._M_local_buf[0] = local_168._M_local_buf[0];
    local_130._M_string_length = local_170;
    local_170 = 0;
    local_168._M_local_buf[0] = '\0';
    local_178 = &local_168;
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)this,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,
                      CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    cVar7 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                    command_table_abi_cxx11_._M_h,(key_type *)this);
    if (cVar7.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      Reporter::fatal_usage<char_const(&)[33],std::__cxx11::string&>
                (local_138,(char (*) [33])"Invalid command specified: \"{}\".",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    }
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        if (args.count("command")) {
            static const std::unordered_set<std::string> command_table{
                "create",
                "extract",
                "encode",
                "transcode",
                "info",
                "validate",
                "compare",
                "help",
            };

            command = to_lower_copy(args["command"].as<std::string>());
            if (command_table.count(*command) == 0)
                report.fatal_usage("Invalid command specified: \"{}\".", *command);
        }
    }